

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

SQInteger __thiscall
SQVM::FallBackSet(SQVM *this,SQObjectPtr *self,SQObjectPtr *key,SQObjectPtr *val)

{
  int iVar1;
  long *plVar2;
  byte bVar3;
  bool bVar4;
  SQWeakRef *in_RCX;
  SQCollectable *in_RDX;
  SQCollectable *in_RSI;
  SQSharedState *in_RDI;
  AutoDec ad;
  SQObjectPtr t;
  SQObjectPtr closure;
  undefined6 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6e;
  SQVM *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  byte in_stack_ffffffffffffff7f;
  AutoDec local_70;
  SQInteger in_stack_ffffffffffffff98;
  SQObjectValue in_stack_ffffffffffffffa0;
  SQObjectPtr *in_stack_ffffffffffffffa8;
  SQObjectValue in_stack_ffffffffffffffb0;
  SQVM *in_stack_ffffffffffffffb8;
  SQBool in_stack_ffffffffffffffd0;
  SQSharedState *pSVar5;
  SQVM *in_stack_fffffffffffffff8;
  
  iVar1 = *(int *)&(in_RSI->super_SQRefCounted)._vptr_SQRefCounted;
  pSVar5 = in_RDI;
  if (iVar1 == 0xa000020) {
    if (*(long *)((in_RSI->super_SQRefCounted)._uiRef + 0x30) != 0) {
      in_stack_ffffffffffffff70 = (SQVM *)&stack0xffffffffffffffc8;
      ::SQObjectPtr::SQObjectPtr
                ((SQObjectPtr *)in_stack_ffffffffffffff70,
                 *(SQTable **)((in_RSI->super_SQRefCounted)._uiRef + 0x30));
      in_stack_ffffffffffffff7f =
           Set(in_stack_ffffffffffffffb8,(SQObjectPtr *)in_stack_ffffffffffffffb0.pTable,
               in_stack_ffffffffffffffa8,(SQObjectPtr *)in_stack_ffffffffffffffa0.pTable,
               in_stack_ffffffffffffff98);
      ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff70);
      if ((in_stack_ffffffffffffff7f & 1) != 0) {
        return 0;
      }
    }
  }
  else if ((iVar1 != 0xa000080) && (iVar1 != 0xa008000)) {
    return 1;
  }
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffffa8);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffff98);
  plVar2 = (long *)(in_RSI->super_SQRefCounted)._uiRef;
  bVar3 = (**(code **)(*plVar2 + 0x30))(plVar2,in_RDI,6,&stack0xffffffffffffffa8);
  if ((bVar3 & 1) != 0) {
    Push(in_stack_ffffffffffffff70,
         (SQObjectPtr *)
         CONCAT17(bVar3,CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)));
    Push(in_stack_ffffffffffffff70,
         (SQObjectPtr *)
         CONCAT17(bVar3,CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)));
    Push(in_stack_ffffffffffffff70,
         (SQObjectPtr *)
         CONCAT17(bVar3,CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)));
    (in_RDI->_instance_default_delegate).super_SQObject._unVal.pTable =
         (SQTable *)
         ((long)&(((in_RDI->_instance_default_delegate).super_SQObject._unVal.pTable)->
                 super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted + 1);
    AutoDec::AutoDec(&local_70,&(in_RDI->_instance_default_delegate).super_SQObject._unVal.nInteger)
    ;
    bVar4 = Call(in_stack_fffffffffffffff8,(SQObjectPtr *)pSVar5,(SQInteger)in_RSI,(SQInteger)in_RDX
                 ,(SQObjectPtr *)in_RCX,in_stack_ffffffffffffffd0);
    if (bVar4) {
      Pop((SQVM *)in_RDI,CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
      in_stack_fffffffffffffff8 = (SQVM *)0x0;
      bVar4 = true;
    }
    else {
      Pop((SQVM *)in_RDI,CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
      if (((SQObjectValue *)&in_RDI->_consts)[1].fFloat == 2.350989e-38) {
        bVar4 = false;
      }
      else {
        in_stack_fffffffffffffff8 = (SQVM *)0x2;
        bVar4 = true;
      }
    }
    AutoDec::~AutoDec(&local_70);
    if (bVar4) goto LAB_001440c4;
  }
  bVar4 = false;
LAB_001440c4:
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff70);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff70);
  if (!bVar4) {
    return 1;
  }
  return (SQInteger)in_stack_fffffffffffffff8;
}

Assistant:

SQInteger SQVM::FallBackSet(const SQObjectPtr &self,const SQObjectPtr &key,const SQObjectPtr &val)
{
    switch(type(self)) {
    case OT_TABLE:
        if(_table(self)->_delegate) {
            if(Set(_table(self)->_delegate,key,val,DONT_FALL_BACK)) return FALLBACK_OK;
        }
        //keps on going
    case OT_INSTANCE:
    case OT_USERDATA:{
        SQObjectPtr closure;
        SQObjectPtr t;
        if(_delegable(self)->GetMetaMethod(this, MT_SET, closure)) {
            Push(self);Push(key);Push(val);
            _nmetamethodscall++;
            AutoDec ad(&_nmetamethodscall);
            if(Call(closure, 3, _top - 3, t, SQFalse)) {
                Pop(3);
                return FALLBACK_OK;
            }
            else {
                Pop(3);
                if(type(_lasterror) != OT_NULL) { //NULL means "clean failure" (not found)
                    return FALLBACK_ERROR;
                }
            }
        }
                     }
        break;
        default: break;//shutup GCC 4.x
    }
    // no metamethod or no fallback type
    return FALLBACK_NO_MATCH;
}